

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O1

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  pointer pCVar1;
  CBlockHeader *pCVar2;
  CBlockIndex *pCVar3;
  uint256 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Logger *pLVar11;
  int i;
  long lVar12;
  CBlockHeader *current;
  long in_FS_OFFSET;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar8 = true;
  if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish == pCVar1) goto LAB_0045fcc7;
  if (this->m_download_state == PRESYNC) {
    CBlockHeader::GetHash(&local_58,&this->m_last_header_received);
    auVar15[0] = -(local_58.super_base_blob<256U>.m_data._M_elems[0] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0]);
    auVar15[1] = -(local_58.super_base_blob<256U>.m_data._M_elems[1] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1]);
    auVar15[2] = -(local_58.super_base_blob<256U>.m_data._M_elems[2] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2]);
    auVar15[3] = -(local_58.super_base_blob<256U>.m_data._M_elems[3] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3]);
    auVar15[4] = -(local_58.super_base_blob<256U>.m_data._M_elems[4] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4]);
    auVar15[5] = -(local_58.super_base_blob<256U>.m_data._M_elems[5] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5]);
    auVar15[6] = -(local_58.super_base_blob<256U>.m_data._M_elems[6] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6]);
    auVar15[7] = -(local_58.super_base_blob<256U>.m_data._M_elems[7] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7]);
    auVar15[8] = -(local_58.super_base_blob<256U>.m_data._M_elems[8] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8]);
    auVar15[9] = -(local_58.super_base_blob<256U>.m_data._M_elems[9] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9]);
    auVar15[10] = -(local_58.super_base_blob<256U>.m_data._M_elems[10] ==
                   (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10]);
    auVar15[0xb] = -(local_58.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar15[0xc] = -(local_58.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar15[0xd] = -(local_58.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar15[0xe] = -(local_58.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar15[0xf] = -(local_58.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar14[0] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar14[1] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar14[2] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar14[3] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar14[4] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar14[5] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar14[6] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar14[7] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar14[8] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar14[9] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar14[10] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar14[0xb] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar14[0xc] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar14[0xd] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar14[0xe] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar14[0xf] = -(local_58.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    (pCVar1->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar14 = auVar14 & auVar15;
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
      current = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar13 = current == pCVar2;
      if (!bVar13) {
        bVar9 = ValidateAndProcessSingleHeader(this,current);
        if (bVar9) {
          do {
            current = current + 1;
            bVar13 = current == pCVar2;
            if (bVar13) goto LAB_0045fde3;
            bVar9 = ValidateAndProcessSingleHeader(this,current);
          } while (bVar9);
        }
        if (!bVar13) goto LAB_0045fcc5;
      }
LAB_0045fde3:
      iVar10 = base_uint<256U>::CompareTo
                         (&(this->m_current_chain_work).super_base_uint<256U>,
                          &(this->m_minimum_required_work).super_base_uint<256U>);
      if (-1 < iVar10) {
        std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                  (&this->m_redownloaded_headers);
        pCVar3 = this->m_chain_start;
        this->m_redownload_buffer_last_height = (long)pCVar3->nHeight;
        puVar4 = pCVar3->phashBlock;
        if (puVar4 != (uint256 *)0x0) {
          uVar5 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
          uVar7 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = uVar7;
          *(undefined8 *)
           (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems = uVar5
          ;
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
               uVar6;
          puVar4 = pCVar3->phashBlock;
          if (puVar4 != (uint256 *)0x0) {
            uVar5 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
            uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
            uVar7 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
                 uVar7;
            *(undefined8 *)
             (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems = uVar5;
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
                 uVar6;
            if (&this->m_redownload_chain_work != &pCVar3->nChainWork) {
              lVar12 = 0;
              do {
                (this->m_redownload_chain_work).super_base_uint<256U>.pn[lVar12] =
                     (pCVar3->nChainWork).super_base_uint<256U>.pn[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 8);
            }
            this->m_download_state = REDOWNLOAD;
            pLVar11 = LogInstance();
            bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar11,NET,Debug);
            if (bVar13) {
              logging_function_00._M_str = "ValidateAndStoreHeadersCommitments";
              logging_function_00._M_len = 0x22;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
              ;
              source_file_00._M_len = 0x5f;
              LogPrintFormatInternal<long,long,long>
                        (logging_function_00,source_file_00,0xad,NET,Debug,
                         (ConstevalFormatString<3U>)0x82aaad,&this->m_id,&this->m_current_height,
                         &this->m_redownload_buffer_last_height);
            }
            goto LAB_0045fcc7;
          }
        }
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      goto LAB_0045fcc7;
    }
    pLVar11 = LogInstance();
    bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar11,NET,Debug);
    if (bVar8) {
      logging_function._M_str = "ValidateAndStoreHeadersCommitments";
      logging_function._M_len = 0x22;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<long,long>
                (logging_function,source_file,0x9a,NET,Debug,(ConstevalFormatString<2U>)0x82aa4d,
                 &this->m_id,&this->m_current_height);
    }
  }
LAB_0045fcc5:
  bVar8 = false;
LAB_0045fcc7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}